

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void ctemplate::anon_unknown_14::WriteOneHeaderEntry
               (string *outstring,string *variable,string *full_pathname)

{
  size_t __n;
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename;
  undefined1 *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar7 = (int)(anonymous_namespace)::g_header_mutex != 0;
  (anonymous_namespace)::g_header_mutex._0_4_ = (int)(anonymous_namespace)::g_header_mutex + -1;
  local_1b8 = outstring;
  if (bVar7) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::vars_seen_abi_cxx11_ == '\0') {
    _GLOBAL__N_1::WriteOneHeaderEntry();
  }
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::current_file_abi_cxx11_ == '\0') {
    _GLOBAL__N_1::WriteOneHeaderEntry();
  }
  if ((anonymous_namespace)::
      WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::prefix_abi_cxx11_ == '\0') {
    _GLOBAL__N_1::WriteOneHeaderEntry();
  }
  __n = full_pathname->_M_string_length;
  if (__n == (anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::current_file_abi_cxx11_._M_string_length) {
    if (__n == 0) goto LAB_00119dbb;
    iVar1 = bcmp((full_pathname->_M_dataplus)._M_p,
                 (anonymous_namespace)::
                 WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::current_file_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_00119dbb;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(anonymous_namespace)::
           WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
           ::vars_seen_abi_cxx11_._M_h);
  std::__cxx11::string::_M_assign
            ((string *)
             &(anonymous_namespace)::
              WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::current_file_abi_cxx11_);
  Basename((string *)local_1a8,full_pathname);
  local_1b0 = variable;
  std::__cxx11::string::_M_replace
            (0x150080,0,
             (char *)(anonymous_namespace)::
                     WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::prefix_abi_cxx11_._M_string_length,0x13f267);
  if (local_1a8._8_8_ != 0) {
    bVar7 = true;
    uVar6 = 0;
    do {
      if (*(char *)(local_1a8._0_8_ + uVar6) == '.') break;
      if (bVar7) {
        std::__cxx11::string::substr((ulong)&local_1d8,(ulong)local_1a8);
        iVar1 = std::__cxx11::string::compare((char *)&local_1d8);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        if (iVar1 == 0) break;
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,
                   (anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::prefix_abi_cxx11_._M_dataplus._M_p,
                   (anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::prefix_abi_cxx11_._M_dataplus._M_p +
                   (anonymous_namespace)::
                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::prefix_abi_cxx11_._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d0,0,'\x01');
        std::__cxx11::string::operator=
                  ((string *)
                   &(anonymous_namespace)::
                    WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::prefix_abi_cxx11_,(string *)&local_1d8);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        bVar7 = false;
      }
      if (*(char *)(local_1a8._0_8_ + uVar6) == '_') {
        bVar7 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)local_1a8._8_8_);
  }
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,
             (anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::prefix_abi_cxx11_._M_dataplus._M_p,
             (anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::prefix_abi_cxx11_._M_dataplus._M_p +
             (anonymous_namespace)::
             WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
             ::prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1d8);
  variable = local_1b0;
  std::__cxx11::string::operator=
            ((string *)
             &(anonymous_namespace)::
              WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::prefix_abi_cxx11_,(string *)&local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
LAB_00119dbb:
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(anonymous_namespace)::
                  WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                  ::vars_seen_abi_cxx11_._M_h,variable);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)variable);
    if (iVar1 != 0) {
      lVar3 = std::__cxx11::string::find((char *)variable,0x133b2c,0);
      if (lVar3 != 0) {
        local_1a8._0_8_ = (variable->_M_dataplus)._M_p;
        local_1a8._8_8_ = variable->_M_string_length;
        local_1a8[0x10] = '\0';
        local_1a8._24_8_ = 0;
        TemplateString::GetGlobalId((TemplateString *)local_1a8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"static const ",0xd)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ctemplate",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"::StaticTemplateString ",0x17);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,
                            (anonymous_namespace)::
                            WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::prefix_abi_cxx11_._M_dataplus._M_p,
                            (anonymous_namespace)::
                            WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::prefix_abi_cxx11_._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(variable->_M_dataplus)._M_p,variable->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = STS_INIT_WITH_HASH(",0x16);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(anonymous_namespace)::
                                   WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::prefix_abi_cxx11_._M_dataplus._M_p,
                            (anonymous_namespace)::
                            WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::prefix_abi_cxx11_._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(variable->_M_dataplus)._M_p,variable->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", \"",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(variable->_M_dataplus)._M_p,variable->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", ",3);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ULL);\n",6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
    }
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(anonymous_namespace)::
                              WriteOneHeaderEntry(std::__cxx11::string*,std::__cxx11::string_const&,std::__cxx11::string_const&)
                              ::vars_seen_abi_cxx11_,variable);
    *pmVar5 = true;
  }
  (anonymous_namespace)::g_header_mutex._0_4_ = (int)(anonymous_namespace)::g_header_mutex + 1;
  if ((int)(anonymous_namespace)::g_header_mutex == 0) {
    return;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xeb,"void ctemplate::Mutex::Unlock()");
}

Assistant:

LOCKS_EXCLUDED(g_header_mutex) {
  MutexLock ml(&g_header_mutex);

  // we use hash_map instead of hash_set just to keep the stl size down
  static hash_map<string, bool, StringHash> vars_seen
      GUARDED_BY(g_header_mutex);
  static string current_file GUARDED_BY(g_header_mutex);
  static string prefix GUARDED_BY(g_header_mutex);

  if (full_pathname != current_file) {
    // changed files so re-initialize the static variables
    vars_seen.clear();
    current_file = full_pathname;

    // remove the path before the filename
    string filename(Basename(full_pathname));

    prefix = "k";
    bool take_next = true;

    for (string::size_type i = 0; i < filename.length(); i++) {
      if (filename[i] == '.') {
        // stop when we find the dot
        break;
      }
      if (take_next) {
        if (filename.substr(i, 4) == "post") {
          // stop before we process post...
          break;
        }
        prefix = prefix + filename[i];
        take_next = false;
      }
      if (filename[i] == '_') {
        take_next = true;
      }
    }
    prefix = prefix + "_";
  }

  // print out the variable, but only if we haven't seen it before.
  if (!vars_seen.count(variable)) {
    if (variable == kMainSectionName || variable.find("BI_") == 0) {
      // We don't want to write entries for __MAIN__ or the built-ins
    } else {
      const TemplateId id = GlobalIdForSTS_INIT(TemplateString(variable));
      std::ostringstream outstream;
      outstream << "static const "
                << AS_STR(GOOGLE_NAMESPACE) << "::StaticTemplateString "
                << prefix << variable << " = STS_INIT_WITH_HASH("
                << prefix << variable << ", \"" << variable << "\", "
                << id << "ULL);\n";
      outstring->append(outstream.str());
    }
    vars_seen[variable] = true;
  }
}